

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  BYTE *iEnd;
  BYTE *iStart;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  U32 *pUVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  U32 UVar11;
  uint uVar12;
  size_t sVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  int *ip;
  int iVar19;
  int *piVar20;
  ulong uVar21;
  bool bVar22;
  uint local_f0;
  
  iEnd = (BYTE *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  pBVar5 = (ms->window).base;
  pBVar6 = (ms->window).dictBase;
  uVar2 = (ms->window).dictLimit;
  uVar3 = (ms->window).lowLimit;
  uVar18 = *rep;
  local_f0 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  iStart = pBVar5 + uVar2;
  ip = (int *)((ulong)(iStart == (BYTE *)src) + (long)src);
LAB_00153ef6:
  do {
    if (piVar1 <= ip) {
      *rep = uVar18;
      rep[1] = local_f0;
      return (long)iEnd - (long)src;
    }
    iVar19 = (int)ip;
    uVar9 = ((iVar19 - (int)pBVar5) - uVar18) + 1;
    uVar12 = uVar18;
    if (uVar3 < uVar9 && 2 < (uVar2 - 1) - uVar9) {
      piVar20 = (int *)((long)ip + 1);
      pBVar14 = pBVar5;
      if (uVar9 < uVar2) {
        pBVar14 = pBVar6;
      }
      if (*piVar20 != *(int *)(pBVar14 + uVar9)) goto LAB_00153f47;
      pBVar15 = iEnd;
      if (uVar9 < uVar2) {
        pBVar15 = pBVar6 + uVar2;
      }
      sVar13 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),pBVar14 + (ulong)uVar9 + 4,iEnd,pBVar15,iStart);
      uVar21 = sVar13 + 4;
      UVar11 = 0;
    }
    else {
LAB_00153f47:
      if (cParams->searchLength - 6 < 2) {
        pUVar7 = ms->chainTable;
        uVar10 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar14 = (ms->window).base;
        pBVar15 = (ms->window).dictBase;
        uVar9 = (ms->window).dictLimit;
        uVar4 = (ms->window).lowLimit;
        uVar16 = iVar19 - (int)pBVar14;
        uVar8 = uVar16 - uVar10;
        if (uVar16 < uVar10) {
          uVar8 = 0;
        }
        iVar19 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
        uVar17 = 99999999;
        uVar21 = 3;
        while( true ) {
          bVar22 = iVar19 == 0;
          iVar19 = iVar19 + -1;
          if ((UVar11 <= uVar4) || (bVar22)) break;
          if (UVar11 < uVar9) {
            if (*(int *)(pBVar15 + UVar11) == *ip) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)(ip + 1),pBVar15 + (ulong)UVar11 + 4,iEnd,pBVar15 + uVar9,
                                  pBVar14 + uVar9);
              sVar13 = sVar13 + 4;
LAB_0015406f:
              if ((uVar21 < sVar13) &&
                 (uVar17 = (ulong)((uVar16 + 2) - UVar11), uVar21 = sVar13,
                 (BYTE *)((long)ip + sVar13) == iEnd)) break;
            }
          }
          else if ((pBVar14 + UVar11)[uVar21] == *(BYTE *)((long)ip + uVar21)) {
            sVar13 = ZSTD_count((BYTE *)ip,pBVar14 + UVar11,iEnd);
            goto LAB_0015406f;
          }
          if (UVar11 <= uVar8) break;
          UVar11 = pUVar7[UVar11 & uVar10 - 1];
        }
      }
      else if (cParams->searchLength == 5) {
        pUVar7 = ms->chainTable;
        uVar10 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar14 = (ms->window).base;
        pBVar15 = (ms->window).dictBase;
        uVar9 = (ms->window).dictLimit;
        uVar4 = (ms->window).lowLimit;
        uVar16 = iVar19 - (int)pBVar14;
        uVar8 = uVar16 - uVar10;
        if (uVar16 < uVar10) {
          uVar8 = 0;
        }
        iVar19 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
        uVar17 = 99999999;
        uVar21 = 3;
        while( true ) {
          bVar22 = iVar19 == 0;
          iVar19 = iVar19 + -1;
          if ((UVar11 <= uVar4) || (bVar22)) break;
          if (UVar11 < uVar9) {
            if (*(int *)(pBVar15 + UVar11) == *ip) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)(ip + 1),pBVar15 + (ulong)UVar11 + 4,iEnd,pBVar15 + uVar9,
                                  pBVar14 + uVar9);
              sVar13 = sVar13 + 4;
LAB_001541c8:
              if ((uVar21 < sVar13) &&
                 (uVar17 = (ulong)((uVar16 + 2) - UVar11), uVar21 = sVar13,
                 (BYTE *)((long)ip + sVar13) == iEnd)) break;
            }
          }
          else if ((pBVar14 + UVar11)[uVar21] == *(BYTE *)((long)ip + uVar21)) {
            sVar13 = ZSTD_count((BYTE *)ip,pBVar14 + UVar11,iEnd);
            goto LAB_001541c8;
          }
          if (UVar11 <= uVar8) break;
          UVar11 = pUVar7[UVar11 & uVar10 - 1];
        }
      }
      else {
        pUVar7 = ms->chainTable;
        uVar10 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar14 = (ms->window).base;
        pBVar15 = (ms->window).dictBase;
        uVar9 = (ms->window).dictLimit;
        uVar4 = (ms->window).lowLimit;
        uVar16 = iVar19 - (int)pBVar14;
        uVar8 = uVar16 - uVar10;
        if (uVar16 < uVar10) {
          uVar8 = 0;
        }
        iVar19 = 1 << ((byte)cParams->searchLog & 0x1f);
        UVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
        uVar17 = 99999999;
        uVar21 = 3;
        while( true ) {
          bVar22 = iVar19 == 0;
          iVar19 = iVar19 + -1;
          if ((UVar11 <= uVar4) || (bVar22)) break;
          if (UVar11 < uVar9) {
            if (*(int *)(pBVar15 + UVar11) == *ip) {
              sVar13 = ZSTD_count_2segments
                                 ((BYTE *)(ip + 1),pBVar15 + (ulong)UVar11 + 4,iEnd,pBVar15 + uVar9,
                                  pBVar14 + uVar9);
              sVar13 = sVar13 + 4;
LAB_00154321:
              if ((uVar21 < sVar13) &&
                 (uVar17 = (ulong)((uVar16 + 2) - UVar11), uVar21 = sVar13,
                 (BYTE *)((long)ip + sVar13) == iEnd)) break;
            }
          }
          else if ((pBVar14 + UVar11)[uVar21] == *(BYTE *)((long)ip + uVar21)) {
            sVar13 = ZSTD_count((BYTE *)ip,pBVar14 + UVar11,iEnd);
            goto LAB_00154321;
          }
          if (UVar11 <= uVar8) break;
          UVar11 = pUVar7[UVar11 & uVar10 - 1];
        }
      }
      UVar11 = (U32)uVar17;
      if (uVar21 < 4) {
        ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
        goto LAB_00153ef6;
      }
      if (uVar17 == 0) {
        UVar11 = 0;
        piVar20 = ip;
      }
      else {
        uVar17 = (long)ip + (2 - (long)(pBVar5 + uVar17));
        pBVar15 = iStart;
        pBVar14 = pBVar5;
        if ((uint)uVar17 < uVar2) {
          pBVar15 = pBVar6 + uVar3;
          pBVar14 = pBVar6;
        }
        pBVar14 = pBVar14 + (uVar17 & 0xffffffff);
        for (; ((src < ip && (pBVar15 < pBVar14)) && (*(BYTE *)((long)ip + -1) == pBVar14[-1]));
            ip = (int *)((long)ip + -1)) {
          pBVar14 = pBVar14 + -1;
          uVar21 = uVar21 + 1;
        }
        piVar20 = ip;
        uVar12 = UVar11 - 2;
        local_f0 = uVar18;
      }
    }
    ZSTD_storeSeq(seqStore,(long)piVar20 - (long)src,src,UVar11,uVar21 - 3);
    for (ip = (int *)((long)piVar20 + uVar21); uVar18 = uVar12, src = ip, ip <= piVar1;
        ip = (int *)((long)ip + sVar13 + 4)) {
      uVar12 = (uint)((long)ip - (long)(pBVar5 + local_f0));
      pBVar14 = pBVar5;
      if (uVar12 < uVar2) {
        pBVar14 = pBVar6;
      }
      if (((uVar12 <= uVar3) || ((uVar2 - 1) - uVar12 < 3)) ||
         (*ip != *(int *)(pBVar14 + ((long)ip - (long)(pBVar5 + local_f0) & 0xffffffff)))) break;
      pBVar15 = iEnd;
      if (uVar12 < uVar2) {
        pBVar15 = pBVar6 + uVar2;
      }
      sVar13 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),
                          (BYTE *)((long)(pBVar14 +
                                         ((long)ip - (long)(pBVar5 + local_f0) & 0xffffffff)) + 4),
                          iEnd,pBVar15,iStart);
      ZSTD_storeSeq(seqStore,0,ip,0,sVar13 + 1);
      uVar12 = local_f0;
      local_f0 = uVar18;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 0);
}